

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool qt_is_ascii(char **ptr,char *end)

{
  undefined1 (*pauVar1) [16];
  uint *puVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  undefined1 (*pauVar6) [16];
  uint *puVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  pauVar6 = (undefined1 (*) [16])*ptr;
  do {
    pauVar1 = pauVar6 + 1;
    if (end < pauVar1) {
      if (*pauVar6 + 8 <= end) {
        uVar3 = *(ulong *)*pauVar6;
        uVar5 = (ushort)((byte)(uVar3 >> 7) & 1) | (ushort)((byte)(uVar3 >> 0xf) & 1) << 1 |
                (ushort)((byte)(uVar3 >> 0x17) & 1) << 2 | (ushort)((byte)(uVar3 >> 0x1f) & 1) << 3
                | (ushort)((byte)(uVar3 >> 0x27) & 1) << 4 |
                (ushort)((byte)(uVar3 >> 0x2f) & 1) << 5 | (ushort)((byte)(uVar3 >> 0x37) & 1) << 6
                | (ushort)(byte)(uVar3 >> 0x3f) << 7;
        uVar9 = uVar5 | 0x100;
        uVar10 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        bVar11 = (char)uVar5 == '\0';
        pcVar8 = *pauVar6 + uVar10;
        if (bVar11) {
          pcVar8 = *pauVar6 + 8;
        }
        *ptr = pcVar8;
        if (!bVar11) {
          return false;
        }
      }
      puVar7 = (uint *)*ptr;
      do {
        puVar2 = puVar7 + 1;
        if (end < puVar2) {
          pcVar8 = *ptr;
          if (pcVar8 == end) {
            return true;
          }
          do {
            bVar11 = -1 < *pcVar8;
            if (!bVar11) {
              return bVar11;
            }
            pcVar8 = pcVar8 + 1;
            *ptr = pcVar8;
          } while (pcVar8 != end);
          return bVar11;
        }
        uVar10 = *puVar7 & 0x80808080;
        if (uVar10 == 0) {
          uVar9 = 0x20;
        }
        else {
          uVar9 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
        }
        puVar7 = (uint *)((long)puVar7 + (ulong)(uVar9 >> 3));
        if (uVar10 == 0) {
          puVar7 = puVar2;
        }
        *ptr = (char *)puVar7;
      } while (uVar10 == 0);
      return false;
    }
    auVar4 = *pauVar6;
    uVar5 = (ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar4[0xf] >> 7) << 0xf;
    uVar10 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    pauVar6 = (undefined1 (*) [16])(*pauVar6 + uVar10);
    if (uVar5 == 0) {
      pauVar6 = pauVar1;
    }
    *ptr = (char *)pauVar6;
  } while (uVar5 == 0);
  return false;
}

Assistant:

bool qt_is_ascii(const char *&ptr, const char *end) noexcept
{
#if defined(__SSE2__)
    // Testing for the high bit can be done efficiently with just PMOVMSKB
    bool loops = true;
    if constexpr (UseAvx2) {
        while (ptr + 32 <= end) {
            __m256i data = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(ptr));
            quint32 mask = _mm256_movemask_epi8(data);
            if (mask) {
                uint idx = qCountTrailingZeroBits(mask);
                ptr += idx;
                return false;
            }
            ptr += 32;
        }
        loops = false;
    }

    while (ptr + 16 <= end) {
        __m128i data = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
        quint32 mask = _mm_movemask_epi8(data);
        if (mask) {
            uint idx = qCountTrailingZeroBits(mask);
            ptr += idx;
            return false;
        }
        ptr += 16;

        if (!loops)
            break;
    }
    if (ptr + 8 <= end) {
        __m128i data = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(ptr));
        quint8 mask = _mm_movemask_epi8(data);
        if (mask) {
            uint idx = qCountTrailingZeroBits(mask);
            ptr += idx;
            return false;
        }
        ptr += 8;
    }
#endif

    while (ptr + 4 <= end) {
        quint32 data = qFromUnaligned<quint32>(ptr);
        if (data &= 0x80808080U) {
            uint idx = QSysInfo::ByteOrder == QSysInfo::BigEndian
                    ? qCountLeadingZeroBits(data)
                    : qCountTrailingZeroBits(data);
            ptr += idx / 8;
            return false;
        }
        ptr += 4;
    }

    while (ptr != end) {
        if (quint8(*ptr) & 0x80)
            return false;
        ++ptr;
    }
    return true;
}